

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BS_thread_pool.hpp
# Opt level: O1

void __thiscall BS::thread_pool::wait_for_tasks(thread_pool *this)

{
  unique_lock<std::mutex> tasks_lock;
  unique_lock<std::mutex> local_20;
  
  LOCK();
  (this->waiting)._M_base._M_i = true;
  UNLOCK();
  local_20._M_device = &this->tasks_mutex;
  local_20._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_20);
  local_20._M_owns = true;
  std::condition_variable::wait<BS::thread_pool::wait_for_tasks()::_lambda()_1_>
            (&this->task_done_cv,&local_20,(anon_class_8_1_8991fb9c)this);
  LOCK();
  (this->waiting)._M_base._M_i = false;
  UNLOCK();
  std::unique_lock<std::mutex>::~unique_lock(&local_20);
  return;
}

Assistant:

void wait_for_tasks()
    {
        waiting = true;
        std::unique_lock<std::mutex> tasks_lock(tasks_mutex);
        task_done_cv.wait(tasks_lock, [this] { return (tasks_total == (paused ? tasks.size() : 0)); });
        waiting = false;
    }